

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_run(lua_State *L)

{
  anon_struct_8_2_fd66bcdd_for_TValue_2 *paVar1;
  ulong uVar2;
  GCstr *pGVar3;
  lua_State *in_RDI;
  TValue *top;
  TValue *errfunc;
  ptrdiff_t ef;
  int in_stack_fffffffffffffefc;
  lua_State *in_stack_ffffffffffffff00;
  TValue *pTVar4;
  lua_State *L_00;
  
  if (*(int *)((ulong)(in_RDI->glref).ptr32 + 400) == 0) {
    L_00 = (lua_State *)finderrfunc(in_RDI);
  }
  else {
    L_00 = (lua_State *)0x0;
  }
  if (L_00 != (lua_State *)0x0) {
    paVar1 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)
             ((long)&(L_00->nextgc).gcptr32 + (ulong)(in_RDI->stack).ptr32);
    pTVar4 = in_RDI->top;
    uVar2 = (ulong)(in_RDI->glref).ptr32;
    *(uint *)(uVar2 + 0x31c) = *(uint *)(uVar2 + 0x31c) & 0xffffffef;
    if ((paVar1->it != 0xfffffff7) || (in_RDI->status == '\x05')) {
      pTVar4 = pTVar4 + -1;
      pGVar3 = lj_err_str(L_00,(ErrMsg)((ulong)pTVar4 >> 0x20));
      (pTVar4->u32).lo = (uint32_t)pGVar3;
      (pTVar4->field_2).it = 0xfffffffb;
      lj_err_throw(in_RDI,in_stack_fffffffffffffefc);
    }
    in_RDI->status = '\x05';
    *pTVar4 = pTVar4[-1];
    pTVar4[-1].field_2 = *paVar1;
    in_RDI->top = pTVar4 + 1;
    lj_vm_call(in_RDI,pTVar4,2);
  }
  lj_err_throw(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}